

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

string * __thiscall
cmdline::parser::option_with_value<int>::full_description
          (string *__return_storage_ptr__,option_with_value<int> *this,string *desc)

{
  bool bVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 *puVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  pcVar2 = (desc->_M_dataplus)._M_p;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + desc->_M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  detail::readable_typename<int>();
  uVar9 = 0xf;
  if (local_a8 != local_98) {
    uVar9 = local_98[0];
  }
  if (uVar9 < (ulong)(local_80 + local_a0)) {
    uVar9 = 0xf;
    if (local_88 != local_78) {
      uVar9 = local_78[0];
    }
    if (uVar9 < (ulong)(local_80 + local_a0)) goto LAB_00145ecb;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_00145ecb:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
  }
  local_e8 = &local_d8;
  puVar7 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar7) {
    local_d8 = *puVar7;
    uStack_d0 = puVar4[3];
  }
  else {
    local_d8 = *puVar7;
    local_e8 = (ulong *)*puVar4;
  }
  local_e0 = puVar4[1];
  *puVar4 = puVar7;
  puVar4[1] = 0;
  *(undefined1 *)puVar7 = 0;
  bVar1 = this->need;
  if (bVar1 == true) {
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
  }
  else {
    detail::
    lexical_cast_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_false>
    ::cast(&local_48,&this->def);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x17032c);
    local_68 = &local_58;
    plVar6 = plVar5 + 2;
    if ((long *)*plVar5 == plVar6) {
      local_58 = *plVar6;
      lStack_50 = plVar5[3];
    }
    else {
      local_58 = *plVar6;
      local_68 = (long *)*plVar5;
    }
    local_60 = plVar5[1];
    *plVar5 = (long)plVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_108 = &local_f8;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_f8 = *puVar7;
      lStack_f0 = plVar5[3];
    }
    else {
      local_f8 = *puVar7;
      local_108 = (ulong *)*plVar5;
    }
    local_100 = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  uVar9 = 0xf;
  if (local_e8 != &local_d8) {
    uVar9 = local_d8;
  }
  if (uVar9 < (ulong)(local_100 + local_e0)) {
    uVar9 = 0xf;
    if (local_108 != &local_f8) {
      uVar9 = local_f8;
    }
    if ((ulong)(local_100 + local_e0) <= uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_e8);
      goto LAB_00146095;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_108);
LAB_00146095:
  local_c8 = &local_b8;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_b8 = *plVar5;
    uStack_b0 = puVar4[3];
  }
  else {
    local_b8 = *plVar5;
    local_c8 = (long *)*puVar4;
  }
  local_c0 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  psVar8 = (size_type *)(plVar5 + 2);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((size_type *)*plVar5 == psVar8) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (bVar1 == false) {
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string full_description(const std::string& desc) {
            return desc + " (" + detail::readable_typename<T>() +
                   (need ? "" : " [=" + detail::lexical_cast<std::string>(def) + "]") + ")";
        }